

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactSonameTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactSonameTag> *this,cmTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  _Rb_tree_header *config;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (this[0x2e6] == (TargetFilesystemArtifactResultCreator<ArtifactSonameTag>)0x1) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_58,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string
              ((string *)&local_38,"TARGET_SONAME_FILE is not allowed for DLL target platforms.",
               &local_59);
    reportError((cmGeneratorExpressionContext *)target,&local_58,&local_38);
  }
  else {
    if (*(int *)(this + 0x2e0) == 2) {
      config = &(target->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header;
      cmTarget::GetDirectory(__return_storage_ptr__,(cmTarget *)this,(string *)config,false);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      cmTarget::GetSOName(&local_58,(cmTarget *)this,(string *)config);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_58);
      return __return_storage_ptr__;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_58,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string
              ((string *)&local_38,"TARGET_SONAME_FILE is allowed only for SHARED libraries.",
               &local_59);
    reportError((cmGeneratorExpressionContext *)target,&local_58,&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmTarget* target,
                            cmGeneratorExpressionContext *context,
                            const GeneratorExpressionContent *content)
  {
    // The target soname file (.so.1).
    if(target->IsDLLPlatform())
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is not allowed "
                    "for DLL target platforms.");
      return std::string();
      }
    if(target->GetType() != cmTarget::SHARED_LIBRARY)
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_SONAME_FILE is allowed only for "
                    "SHARED libraries.");
      return std::string();
      }
    std::string result = target->GetDirectory(context->Config);
    result += "/";
    result += target->GetSOName(context->Config);
    return result;
  }